

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
pstore::json::details::whitespace_matcher<pstore::exchange::import_ns::callbacks>::cr
          (whitespace_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,state next)

{
  uint *puVar1;
  
  if (((this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ | 4U) == 6) {
    (parser->coordinate_).column = 0;
    puVar1 = &(parser->coordinate_).row;
    *puVar1 = *puVar1 + 1;
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = next;
    return;
  }
  assert_failed("this->get_state () == multi_line_comment_body_state || this->get_state () == body_state"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x574);
}

Assistant:

void set_state (int const s) noexcept { state_ = s; }